

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsIterationMultipleDims(void)

{
  allocator<int> *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  iterator ptVar4;
  const_reference pvVar5;
  Span<const_int,_18446744073709551615UL> SVar6;
  SliceIterator SVar7;
  SliceIterator SVar8;
  int i;
  iterator __end3;
  iterator __begin3;
  Span<const_int,_18446744073709551615UL> *__range3;
  undefined1 auStack_1b8 [4];
  int sum;
  Span<const_int,_18446744073709551615UL> row;
  SliceIterator __end2;
  SliceIterator __begin2;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> *__range2;
  size_t rowIndex;
  undefined1 local_150 [8];
  Span<const_int,_18446744073709551615UL> span2d;
  SliceIterator __end1;
  SliceIterator __begin1;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> *__range1;
  Span<const_int,_18446744073709551615UL> span;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> expectedRowSums;
  allocator<int> local_99;
  int local_98 [24];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_98[0x14] = 9;
  local_98[0x15] = 10;
  local_98[0x16] = 0xb;
  local_98[0x17] = 0xc;
  local_98[0x10] = 5;
  local_98[0x11] = 6;
  local_98[0x12] = 7;
  local_98[0x13] = 8;
  local_98[0xc] = 1;
  local_98[0xd] = 2;
  local_98[0xe] = 3;
  local_98[0xf] = 4;
  local_98[8] = 9;
  local_98[9] = 10;
  local_98[10] = 0xb;
  local_98[0xb] = 0xc;
  local_98[4] = 5;
  local_98[5] = 6;
  local_98[6] = 7;
  local_98[7] = 8;
  local_98[0] = 1;
  local_98[1] = 2;
  local_98[2] = 3;
  local_98[3] = 4;
  local_38 = local_98;
  local_30 = 0x18;
  std::allocator<int>::allocator(&local_99);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_00,&local_99);
  std::allocator<int>::~allocator(&local_99);
  span.m_size.m_size._4_4_ = 10;
  this = (allocator<int> *)((long)&span.m_size.m_size + 3);
  std::allocator<int>::allocator(this);
  __l._M_len = 3;
  __l._M_array = (iterator)((long)&span.m_size.m_size + 4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c8,__l,this);
  std::allocator<int>::~allocator((allocator<int> *)((long)&span.m_size.m_size + 3));
  SVar6 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  span.m_ptr = (pointer)SVar6.m_size.m_size;
  __range1 = (IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
              *)SVar6.m_ptr;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateByDimension
            ((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
              *)&__begin1.m_stride,(Span<const_int,_18446744073709551615UL> *)&__range1,2);
  SVar7 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::
          IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>::
          begin((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
                 *)&__begin1.m_stride);
  __begin1.m_ptr = (pointer)SVar7.m_stride;
  __end1.m_stride = (size_t)SVar7.m_ptr;
  SVar7 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::
          IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>::
          end((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
               *)&__begin1.m_stride);
  do {
    __end1.m_ptr = (pointer)SVar7.m_stride;
    span2d.m_size.m_size = (size_t)SVar7.m_ptr;
    bVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator!=
                      ((SliceIterator *)&__end1.m_stride,(SliceIterator *)&span2d.m_size);
    if (!bVar1) {
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
LAB_001c6e4a:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c8)
      ;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28)
      ;
      return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
    }
    SVar6 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator*
                      ((SliceIterator *)&__end1.m_stride);
    span2d.m_ptr = (pointer)SVar6.m_size.m_size;
    local_150 = (undefined1  [8])SVar6.m_ptr;
    sVar2 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Size
                      ((Span<const_int,_18446744073709551615UL> *)local_150);
    if (sVar2 != 0xc) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x281);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(span2d.Size()) == (size_t(12))");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      goto LAB_001c6e4a;
    }
    __range2 = (IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
                *)0x0;
    MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateByDimension
              ((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
                *)&__begin2.m_stride,(Span<const_int,_18446744073709551615UL> *)local_150,3);
    SVar7 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::
            IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
            ::begin((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
                     *)&__begin2.m_stride);
    __begin2.m_ptr = (pointer)SVar7.m_stride;
    __end2.m_stride = (size_t)SVar7.m_ptr;
    SVar8 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::
            IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
            ::end((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
                   *)&__begin2.m_stride);
    while( true ) {
      __end2.m_ptr = (pointer)SVar8.m_stride;
      row.m_size.m_size = (size_t)SVar8.m_ptr;
      bVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator!=
                        ((SliceIterator *)&__end2.m_stride,(SliceIterator *)&row.m_size);
      if (!bVar1) break;
      SVar6 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator*
                        ((SliceIterator *)&__end2.m_stride);
      row.m_ptr = (pointer)SVar6.m_size.m_size;
      _auStack_1b8 = SVar6.m_ptr;
      sVar2 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Size
                        ((Span<const_int,_18446744073709551615UL> *)auStack_1b8);
      if (sVar2 != 4) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x285);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(row.Size()) == (size_t(4))");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
        goto LAB_001c6e4a;
      }
      __range3._4_4_ = 0;
      __end3 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::begin
                         ((Span<const_int,_18446744073709551615UL> *)auStack_1b8);
      ptVar4 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::end
                         ((Span<const_int,_18446744073709551615UL> *)auStack_1b8);
      for (; __end3 != ptVar4; __end3 = __end3 + 1) {
        __range3._4_4_ = *__end3 + __range3._4_4_;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_c8,(size_type)__range2);
      if (__range3._4_4_ != *pvVar5) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28c);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(sum) == (expectedRowSums[rowIndex++])");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
        goto LAB_001c6e4a;
      }
      MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator++
                ((SliceIterator *)&__end2.m_stride);
      SVar8.m_stride = (size_t)__end2.m_ptr;
      SVar8.m_ptr = (pointer)row.m_size.m_size;
      __range2 = (IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
                  *)((long)&(__range2->m_begin).m_ptr + 1);
    }
    MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator++
              ((SliceIterator *)&__end1.m_stride);
    SVar7.m_stride = (size_t)__end1.m_ptr;
    SVar7.m_ptr = (pointer)span2d.m_size.m_size;
  } while( true );
}

Assistant:

int testSpanTestsIterationMultipleDims()
{
    // clang-format off
    const std::vector<int> values = {
        // shape: [2, 3, 4]
        /*0*/
        1, 2, 3, 4,
        5, 6, 7, 8,
        9, 10, 11, 12,
        /*1*/
        1, 2, 3, 4,
        5, 6, 7, 8,
        9, 10, 11, 12
    };
    // clang-format on

    const std::vector<int> expectedRowSums = {10, 26, 42};

    auto span = MakeSpan(values);

    for (auto span2d : span.IterateByDimension(2)) {
        ML_ASSERT_EQ(span2d.Size(), size_t(12));

        size_t rowIndex = 0;
        for (auto row : span2d.IterateByDimension(3)) {
            ML_ASSERT_EQ(row.Size(), size_t(4));

            int sum = 0;
            for (auto i : row) {
                sum += i;
            }

            ML_ASSERT_EQ(sum, expectedRowSums[rowIndex++]);
        }
    }

    return 0;
}